

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HeapInfo.h
# Opt level: O0

ValidPointers<MediumAllocationBlockAttributes> __thiscall
Memory::HeapInfo::ValidPointersMap<MediumAllocationBlockAttributes>::GetValidPointersForIndex
          (ValidPointersMap<MediumAllocationBlockAttributes> *this,uint bucketIndex)

{
  code *pcVar1;
  bool bVar2;
  undefined8 *in_FS_OFFSET;
  ushort *validPointers;
  uint bucketIndex_local;
  ValidPointersMap<MediumAllocationBlockAttributes> *this_local;
  
  if (0x1c < bucketIndex) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    *(undefined4 *)*in_FS_OFFSET = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/HeapInfo.h"
                       ,0x17c,"(bucketIndex < TBlockAttributes::BucketCount)",
                       "bucketIndex < TBlockAttributes::BucketCount");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *(undefined4 *)*in_FS_OFFSET = 0;
  }
  ValidPointers<MediumAllocationBlockAttributes>::ValidPointers
            ((ValidPointers<MediumAllocationBlockAttributes> *)&this_local,
             this->validPointersBuffer[bucketIndex],bucketIndex);
  return _this_local;
}

Assistant:

inline const ValidPointers<TBlockAttributes> GetValidPointersForIndex(uint bucketIndex) const
        {
            AnalysisAssert(bucketIndex < TBlockAttributes::BucketCount);
            ushort const * validPointers = nullptr;
#if USE_VPM_TABLE
            validPointers = validPointersBuffer[bucketIndex];
#endif
            return ValidPointers<TBlockAttributes>(validPointers, bucketIndex);
        }